

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreBinarySerializer.cpp
# Opt level: O3

void __thiscall
Assimp::Ogre::OgreBinarySerializer::ReadSubMeshNames(OgreBinarySerializer *this,Mesh *mesh)

{
  StreamReader<false,_false> *pSVar1;
  unsigned_short uVar2;
  uint uVar3;
  SubMesh *pSVar4;
  Logger *this_00;
  runtime_error *this_01;
  MemoryStreamReader *this_02;
  bool bVar5;
  long *local_1c8 [2];
  long local_1b8 [2];
  string local_1a8 [3];
  ios_base local_138 [264];
  
  pSVar1 = this->m_reader;
  if (*(int *)&pSVar1->end != *(int *)&pSVar1->current) {
    uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
    uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
    this->m_currentLen = uVar3;
    this_02 = this->m_reader;
    bVar5 = *(int *)&this_02->end == *(int *)&this_02->current;
    if ((uVar2 == 0xa100) && (*(int *)&this_02->end != *(int *)&this_02->current)) {
      do {
        uVar2 = StreamReader<false,_false>::Get<unsigned_short>(this_02);
        pSVar4 = Mesh::GetSubMesh(mesh,(ulong)uVar2);
        if (pSVar4 == (SubMesh *)0x0) {
          this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,"Ogre Mesh does not include submesh ",0x23);
          std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,
                     " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file.",0x3f);
          std::__cxx11::stringbuf::str();
          std::runtime_error::runtime_error(this_01,(string *)local_1c8);
          *(undefined ***)this_01 = &PTR__runtime_error_0080bf48;
          __cxa_throw(this_01,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
        }
        ReadLine_abi_cxx11_(local_1a8,this);
        std::__cxx11::string::operator=
                  ((string *)&(pSVar4->super_ISubMesh).name,(string *)local_1a8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
          operator_delete(local_1a8[0]._M_dataplus._M_p,
                          local_1a8[0].field_2._M_allocated_capacity + 1);
        }
        this_00 = DefaultLogger::get();
        Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::
        basic_formatter<char[13]>
                  ((basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1a8
                   ,(char (*) [13])"  - SubMesh ");
        std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," name \'",7);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,(pSVar4->super_ISubMesh).name._M_dataplus._M_p,
                   (pSVar4->super_ISubMesh).name._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\'",1);
        std::__cxx11::stringbuf::str();
        Logger::debug(this_00,(char *)local_1c8[0]);
        if (local_1c8[0] != local_1b8) {
          operator_delete(local_1c8[0],local_1b8[0] + 1);
        }
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
        std::ios_base::~ios_base(local_138);
        pSVar1 = this->m_reader;
        if (*(int *)&pSVar1->end == *(int *)&pSVar1->current) {
          return;
        }
        uVar2 = StreamReader<false,_false>::Get<unsigned_short>(pSVar1);
        uVar3 = StreamReader<false,_false>::Get<unsigned_int>(this->m_reader);
        this->m_currentLen = uVar3;
        this_02 = this->m_reader;
        bVar5 = *(int *)&this_02->end == *(int *)&this_02->current;
      } while ((uVar2 == 0xa100) && (*(int *)&this_02->end != *(int *)&this_02->current));
    }
    if (!bVar5) {
      StreamReader<false,_false>::IncPtr(this_02,-6);
    }
  }
  return;
}

Assistant:

void OgreBinarySerializer::ReadSubMeshNames(Mesh *mesh)
{
    uint16_t id = 0;

    if (!AtEnd())
    {
        id = ReadHeader();
        while (!AtEnd() && id == M_SUBMESH_NAME_TABLE_ELEMENT)
        {
            uint16_t submeshIndex = Read<uint16_t>();
            SubMesh *submesh = mesh->GetSubMesh(submeshIndex);
            if (!submesh) {
                throw DeadlyImportError(Formatter::format() << "Ogre Mesh does not include submesh " << submeshIndex << " referenced in M_SUBMESH_NAME_TABLE_ELEMENT. Invalid mesh file.");
            }

            submesh->name = ReadLine();
            ASSIMP_LOG_DEBUG_F( "  - SubMesh ", submesh->index, " name '", submesh->name, "'");

            if (!AtEnd())
                id = ReadHeader();
        }
        if (!AtEnd())
            RollbackHeader();
    }
}